

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

char * toml::Value::typeToString(Type type)

{
  if (type < 8) {
    return &DAT_00160878 + *(int *)(&DAT_00160878 + (ulong)type * 4);
  }
  return "unknown";
}

Assistant:

inline const char* Value::typeToString(Value::Type type)
{
    switch (type) {
    case NULL_TYPE:   return "null";
    case BOOL_TYPE:   return "bool";
    case INT_TYPE:    return "int";
    case DOUBLE_TYPE: return "double";
    case STRING_TYPE: return "string";
    case TIME_TYPE:   return "time";
    case ARRAY_TYPE:  return "array";
    case TABLE_TYPE:  return "table";
    default:          return "unknown";
    }
}